

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O1

Cord __thiscall absl::lts_20240722::Cord::Subcord(Cord *this,size_t pos,size_t new_size)

{
  undefined8 uVar1;
  bool bVar2;
  Nonnull<cord_internal::CordRep_*> tree;
  ulong in_RCX;
  ulong uVar3;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  long lVar4;
  Nonnull<cord_internal::CordRep_*> pCVar5;
  ulong uVar6;
  ulong n;
  undefined4 uVar7;
  undefined4 extraout_XMM0_Da;
  undefined4 uVar8;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar9;
  undefined4 extraout_XMM0_Dc;
  undefined4 uVar10;
  undefined4 extraout_XMM0_Dd;
  Cord CVar11;
  ChunkIterator local_c8;
  
  uVar7 = 0;
  uVar8 = 0;
  uVar9 = 0;
  uVar10 = 0;
  (this->contents_).data_.rep_.field_0.as_tree.cordz_info = 0;
  (this->contents_).data_.rep_.field_0.as_tree.rep = (CordRep *)0x0;
  uVar3 = (ulong)(char)*(byte *)pos;
  if ((uVar3 & 1) == 0) {
    uVar6 = uVar3 >> 1;
  }
  else {
    uVar6 = **(ulong **)(pos + 8);
  }
  if (uVar6 < new_size) {
    new_size = uVar6;
  }
  n = uVar6 - new_size;
  if (in_RCX <= uVar6 - new_size) {
    n = in_RCX;
  }
  if (n == 0) goto LAB_0010dffa;
  tree = *(Nonnull<cord_internal::CordRep_*> *)(pos + 8);
  if (tree == (Nonnull<cord_internal::CordRep_*>)0x0 || (*(byte *)pos & 1) == 0) {
    lVar4 = 0;
    if ((uVar3 & 1) == 0) {
      lVar4 = pos + 1;
    }
    cord_internal::InlineData::set_inline_data((InlineData *)this,(char *)(lVar4 + new_size),n);
    uVar3 = extraout_RDX;
    goto LAB_0010dffa;
  }
  if (0xf < n) {
    if (tree->tag == '\x02') {
      tree = (Nonnull<cord_internal::CordRep_*>)tree[1].length;
    }
    if (tree->tag == '\x03') {
      tree = (Nonnull<cord_internal::CordRep_*>)
             absl::lts_20240722::cord_internal::CordRepBtree::SubTree((ulong)tree,new_size);
    }
    else {
      if (tree == (Nonnull<cord_internal::CordRep_*>)0x0) {
        __assert_fail("rep != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O1/_deps/absl-src/absl/strings/internal/cord_internal.h"
                      ,0x1a1,
                      "static CordRep *absl::cord_internal::CordRepSubstring::Substring(CordRep *, size_t, size_t)"
                     );
      }
      uVar3 = tree->length;
      if (uVar3 <= new_size) {
        __assert_fail("pos < rep->length",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O1/_deps/absl-src/absl/strings/internal/cord_internal.h"
                      ,0x1a3,
                      "static CordRep *absl::cord_internal::CordRepSubstring::Substring(CordRep *, size_t, size_t)"
                     );
      }
      if (uVar3 - new_size < n) {
        __assert_fail("n <= rep->length - pos",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O1/_deps/absl-src/absl/strings/internal/cord_internal.h"
                      ,0x1a4,
                      "static CordRep *absl::cord_internal::CordRepSubstring::Substring(CordRep *, size_t, size_t)"
                     );
      }
      if (uVar3 == n) {
        LOCK();
        (tree->refcount).count_.super___atomic_base<int>._M_i =
             (tree->refcount).count_.super___atomic_base<int>._M_i + 2;
        UNLOCK();
      }
      else {
        pCVar5 = tree;
        if (tree->tag == '\x01') {
          new_size = new_size + tree[1].length;
          pCVar5 = *(Nonnull<cord_internal::CordRep_*> *)&tree[1].refcount;
        }
        tree = (Nonnull<cord_internal::CordRep_*>)operator_new(0x20);
        tree->length = 0;
        tree->refcount = (atomic<int>)0x0;
        tree->tag = '\0';
        tree->storage[0] = '\0';
        tree->storage[1] = '\0';
        tree->storage[2] = '\0';
        tree[1].length = 0;
        tree[1].refcount = (atomic<int>)0x0;
        tree[1].tag = '\0';
        tree[1].storage[0] = '\0';
        tree[1].storage[1] = '\0';
        tree[1].storage[2] = '\0';
        (tree->refcount).count_.super___atomic_base<int>._M_i = 2;
        tree->length = n;
        tree->tag = '\x01';
        tree[1].length = new_size;
        if (pCVar5 == (Nonnull<cord_internal::CordRep_*>)0x0) {
          __assert_fail("rep != nullptr",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O1/_deps/absl-src/absl/strings/internal/cord_internal.h"
                        ,0x370,"static CordRep *absl::cord_internal::CordRep::Ref(CordRep *)");
        }
        LOCK();
        (pCVar5->refcount).count_.super___atomic_base<int>._M_i =
             (pCVar5->refcount).count_.super___atomic_base<int>._M_i + 2;
        UNLOCK();
        *(Nonnull<cord_internal::CordRep_*> *)&tree[1].refcount = pCVar5;
      }
    }
    (this->contents_).data_.rep_.field_0.as_tree.rep = tree;
    (this->contents_).data_.rep_.field_0.as_tree.cordz_info = 1;
    bVar2 = cord_internal::InlineData::is_either_profiled((InlineData *)this,(InlineData *)pos);
    uVar3 = extraout_RDX_01;
    if (bVar2) {
      absl::lts_20240722::cord_internal::CordzInfo::MaybeTrackCordImpl
                ((InlineData *)this,(InlineData *)pos,kSubCord);
      uVar3 = extraout_RDX_02;
    }
    goto LAB_0010dffa;
  }
  (this->contents_).data_.rep_.field_0.data[0] = (char)n * '\x02';
  local_c8.current_leaf_ = (Nullable<absl::cord_internal::CordRep_*>)0x0;
  local_c8.bytes_remaining_ = 0;
  local_c8.current_chunk_ = (string_view)ZEXT816(0);
  local_c8.btree_reader_.remaining_ = 0;
  local_c8.btree_reader_.navigator_.height_ = -1;
  if (tree == (Nonnull<cord_internal::CordRep_*>)0x0 || (uVar3 & 1) == 0) {
    if ((uVar3 & 1) == 0) {
      local_c8.bytes_remaining_ = uVar3 >> 1;
      pos = pos + 1;
      local_c8.current_chunk_._M_str = (char *)pos;
      local_c8.current_chunk_._M_len = local_c8.bytes_remaining_;
    }
    else {
      Subcord();
      uVar7 = extraout_XMM0_Da;
      uVar8 = extraout_XMM0_Db;
      uVar9 = extraout_XMM0_Dc;
      uVar10 = extraout_XMM0_Dd;
LAB_0010e059:
      local_c8.current_chunk_._M_len._4_4_ = uVar8;
      local_c8.current_chunk_._M_len._0_4_ = uVar7;
      local_c8.current_chunk_._M_str._0_4_ = uVar9;
      local_c8.current_chunk_._M_str._4_4_ = uVar10;
    }
  }
  else {
    local_c8.bytes_remaining_ = tree->length;
    if (local_c8.bytes_remaining_ == 0) goto LAB_0010e059;
    ChunkIterator::InitTree(&local_c8,tree);
  }
  if (local_c8.bytes_remaining_ < new_size) {
    __assert_fail("bytes_remaining_ >= n",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O1/_deps/absl-src/absl/strings/cord.h"
                  ,0x647,"void absl::Cord::ChunkIterator::AdvanceBytes(size_t)");
  }
  if (local_c8.current_chunk_._M_len < new_size || local_c8.current_chunk_._M_len - new_size == 0) {
    if (new_size != 0) {
      if (((long)local_c8.btree_reader_.navigator_.height_ < 0) ||
         (local_c8.btree_reader_.navigator_.node_[local_c8.btree_reader_.navigator_.height_] ==
          (CordRepBtree *)0x0)) {
        local_c8.bytes_remaining_ = 0;
      }
      else {
        ChunkIterator::AdvanceBytesBtree(&local_c8,new_size);
      }
    }
  }
  else {
    local_c8.current_chunk_._M_str = local_c8.current_chunk_._M_str + new_size;
    local_c8.current_chunk_._M_len = local_c8.current_chunk_._M_len - new_size;
    local_c8.bytes_remaining_ = local_c8.bytes_remaining_ - new_size;
  }
  if (local_c8.bytes_remaining_ != 0) {
    pos = (size_t)((this->contents_).data_.rep_.field_0.data + 1);
    uVar3 = n;
    do {
      uVar6 = uVar3 - local_c8.current_chunk_._M_len;
      if (uVar3 < local_c8.current_chunk_._M_len || uVar6 == 0) goto LAB_0010defc;
      if (local_c8.current_chunk_._M_len < 8) {
        if (local_c8.current_chunk_._M_len < 4) {
          if (local_c8.current_chunk_._M_len != 0) {
            *(char *)pos = *local_c8.current_chunk_._M_str;
            *(char *)(pos + (local_c8.current_chunk_._M_len >> 1)) =
                 local_c8.current_chunk_._M_str[local_c8.current_chunk_._M_len >> 1];
            *(char *)(pos + (local_c8.current_chunk_._M_len - 1)) =
                 local_c8.current_chunk_._M_str[local_c8.current_chunk_._M_len - 1];
          }
        }
        else {
          uVar7 = *(undefined4 *)
                   (local_c8.current_chunk_._M_str + (local_c8.current_chunk_._M_len - 4));
          *(undefined4 *)pos = *(undefined4 *)local_c8.current_chunk_._M_str;
          *(undefined4 *)(pos + (local_c8.current_chunk_._M_len - 4)) = uVar7;
        }
      }
      else {
        if (0xf < local_c8.current_chunk_._M_len) goto LAB_0010e088;
        uVar1 = *(undefined8 *)
                 (local_c8.current_chunk_._M_str + (local_c8.current_chunk_._M_len - 8));
        *(undefined8 *)pos = *(undefined8 *)local_c8.current_chunk_._M_str;
        *(undefined8 *)(pos + (local_c8.current_chunk_._M_len - 8)) = uVar1;
      }
      pos = pos + local_c8.current_chunk_._M_len;
      uVar3 = local_c8.bytes_remaining_ - local_c8.current_chunk_._M_len;
      if (local_c8.bytes_remaining_ < local_c8.current_chunk_._M_len) {
        __assert_fail("bytes_remaining_ >= current_chunk_.size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O1/_deps/absl-src/absl/strings/cord.h"
                      ,0x61b,"Cord::ChunkIterator &absl::Cord::ChunkIterator::operator++()");
      }
      local_c8.bytes_remaining_ = uVar3;
      if (uVar3 != 0) {
        if (((long)local_c8.btree_reader_.navigator_.height_ < 0) ||
           (local_c8.btree_reader_.navigator_.node_[local_c8.btree_reader_.navigator_.height_] ==
            (CordRepBtree *)0x0)) {
          if (local_c8.current_chunk_._M_len == 0) {
            __assert_fail("!current_chunk_.empty()",
                          "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O1/_deps/absl-src/absl/strings/cord.h"
                          ,0x621,"Cord::ChunkIterator &absl::Cord::ChunkIterator::operator++()");
          }
          local_c8.current_chunk_ = (string_view)ZEXT816(0);
        }
        else {
          local_c8.current_chunk_ = cord_internal::CordRepBtreeReader::Next(&local_c8.btree_reader_)
          ;
        }
      }
      uVar3 = uVar6;
    } while (local_c8.bytes_remaining_ != 0);
  }
  Subcord();
  uVar3 = extraout_RDX_00;
LAB_0010defc:
  if (uVar3 < 8) {
    if (uVar3 < 4) {
      if (uVar3 != 0) {
        *(char *)pos = *local_c8.current_chunk_._M_str;
        *(char *)(pos + (uVar3 >> 1)) = local_c8.current_chunk_._M_str[uVar3 >> 1];
        *(char *)(pos + (uVar3 - 1)) = local_c8.current_chunk_._M_str[uVar3 - 1];
      }
    }
    else {
      uVar7 = *(undefined4 *)(local_c8.current_chunk_._M_str + (uVar3 - 4));
      *(undefined4 *)pos = *(undefined4 *)local_c8.current_chunk_._M_str;
      *(undefined4 *)(pos + (uVar3 - 4)) = uVar7;
    }
  }
  else {
    if (0xf < uVar3) {
LAB_0010e088:
      __assert_fail("n <= 15",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O1/_deps/absl-src/absl/strings/internal/cord_internal.h"
                    ,0x60,
                    "void absl::cord_internal::SmallMemmove(char *, const char *, size_t) [nullify_tail = false]"
                   );
    }
    uVar1 = *(undefined8 *)(local_c8.current_chunk_._M_str + (uVar3 - 8));
    *(undefined8 *)pos = *(undefined8 *)local_c8.current_chunk_._M_str;
    *(undefined8 *)(pos + (uVar3 - 8)) = uVar1;
  }
LAB_0010dffa:
  CVar11.contents_.data_.rep_.field_0.as_tree.rep = (CordRep *)uVar3;
  CVar11.contents_.data_.rep_.field_0.as_tree.cordz_info = (cordz_info_t)this;
  return (Cord)CVar11.contents_.data_.rep_.field_0;
}

Assistant:

Cord Cord::Subcord(size_t pos, size_t new_size) const {
  Cord sub_cord;
  size_t length = size();
  if (pos > length) pos = length;
  if (new_size > length - pos) new_size = length - pos;
  if (new_size == 0) return sub_cord;

  CordRep* tree = contents_.tree();
  if (tree == nullptr) {
    sub_cord.contents_.set_data(contents_.data() + pos, new_size);
    return sub_cord;
  }

  if (new_size <= InlineRep::kMaxInline) {
    sub_cord.contents_.set_inline_size(new_size);
    char* dest = sub_cord.contents_.data_.as_chars();
    Cord::ChunkIterator it = chunk_begin();
    it.AdvanceBytes(pos);
    size_t remaining_size = new_size;
    while (remaining_size > it->size()) {
      cord_internal::SmallMemmove(dest, it->data(), it->size());
      remaining_size -= it->size();
      dest += it->size();
      ++it;
    }
    cord_internal::SmallMemmove(dest, it->data(), remaining_size);
    return sub_cord;
  }

  tree = cord_internal::SkipCrcNode(tree);
  if (tree->IsBtree()) {
    tree = tree->btree()->SubTree(pos, new_size);
  } else {
    tree = CordRepSubstring::Substring(tree, pos, new_size);
  }
  sub_cord.contents_.EmplaceTree(tree, contents_.data_,
                                 CordzUpdateTracker::kSubCord);
  return sub_cord;
}